

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_strutils.cpp
# Opt level: O2

bool crnlib::string_to_uint(char **pBuf,uint *value)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  
  *value = 0;
  for (pcVar6 = *pBuf; cVar1 = *pcVar6, cVar1 != '\0'; pcVar6 = pcVar6 + 1) {
    iVar2 = isspace((int)cVar1);
    if (iVar2 == 0) {
      uVar4 = 0;
      if ((int)cVar1 - 0x30U < 10) goto LAB_00136137;
      goto LAB_00136168;
    }
  }
  goto LAB_00136166;
  while( true ) {
    uVar3 = uVar4 * 10;
    pcVar6 = pcVar6 + 1;
    uVar4 = uVar3 + uVar5;
    if (CARRY4(uVar3,uVar5)) break;
LAB_00136137:
    if ((*pcVar6 == '\0') || (uVar5 = (int)*pcVar6 - 0x30, 9 < uVar5)) {
      *value = uVar4;
      *pBuf = pcVar6;
      uVar4 = 1;
      goto LAB_00136168;
    }
    if ((0x1fffffff < uVar4) || (CARRY4(uVar4 * 8,uVar4 * 2))) break;
  }
LAB_00136166:
  uVar4 = 0;
LAB_00136168:
  return SUB41(uVar4,0);
}

Assistant:

bool string_to_uint(const char*& pBuf, uint& value)
    {
        value = 0;

        CRNLIB_ASSERT(pBuf);
        const char* p = pBuf;

        while (*p && isspace(*p))
        {
            p++;
        }

        uint result = 0;

        if (!isdigit(*p))
        {
            return false;
        }

        while (*p && isdigit(*p))
        {
            if (result & 0xE0000000U)
            {
                return false;
            }

            const uint result8 = result << 3U;
            const uint result2 = result << 1U;

            if (result2 > (0xFFFFFFFFU - result8))
            {
                return false;
            }

            result = result8 + result2;

            uint c = p[0] - '0';
            if (c > (0xFFFFFFFFU - result))
            {
                return false;
            }

            result += c;

            p++;
        }

        value = result;

        pBuf = p;

        return true;
    }